

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_system.cpp
# Opt level: O3

string * __thiscall
LinearSystem::ToString_abi_cxx11_(string *__return_storage_ptr__,LinearSystem *this)

{
  string *psVar1;
  int iVar2;
  Matrix *this_00;
  int iVar3;
  int iVar4;
  Operation *operation;
  pointer pOVar5;
  int iVar6;
  int iVar7;
  bool bVar8;
  SwapMatrix swaps;
  ostringstream out;
  LinearSystem current_system;
  int local_324;
  SwapMatrix local_318;
  string *local_2f8;
  ExtendedMatrix *local_2f0;
  pointer local_2e8;
  long local_2e0 [14];
  ios_base local_270 [264];
  LinearSystem local_168;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2e0);
  LinearSystem(&local_168,&this->start_system_,this->mode_);
  local_2f8 = __return_storage_ptr__;
  operator<<((ostream *)local_2e0,&local_168.system_);
  local_318.first_row_ = 0;
  local_318.second_row_ = 0;
  local_318.first_main_column_ = 0;
  local_318.second_main_column_ = 0;
  local_318.first_extension_column_ = 0;
  local_318.second_extension_column_ = 0;
  pOVar5 = (this->history_).
           super__Vector_base<LinearSystem::Operation,_std::allocator<LinearSystem::Operation>_>.
           _M_impl.super__Vector_impl_data._M_start;
  local_2e8 = (this->history_).
              super__Vector_base<LinearSystem::Operation,_std::allocator<LinearSystem::Operation>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  if (pOVar5 != local_2e8) {
    local_2f0 = &this->system_;
    iVar2 = 0;
    iVar3 = 0;
    iVar7 = 0;
    iVar4 = 0;
    local_324 = 0;
    iVar6 = 0;
    do {
      ApplyOperation(&local_168,pOVar5->operation_type,pOVar5->lhs,pOVar5->rhs,pOVar5->coefficient);
      if (pOVar5->operation_type == SwapColumns) {
        iVar4 = pOVar5->lhs + 1;
        iVar7 = pOVar5->rhs + 1;
        local_318.second_main_column_ = iVar7;
        local_318.first_main_column_ = iVar4;
      }
      else if (pOVar5->operation_type == SwapRows) {
        iVar6 = pOVar5->lhs + 1;
        local_324 = pOVar5->rhs + 1;
        local_318.second_row_ = local_324;
        local_318.first_row_ = iVar6;
        if (this->mode_ == LU) {
          this_00 = ExtendedMatrix::GetMainMatrix(local_2f0);
          iVar2 = Matrix::GetNumColumns(this_00);
          iVar3 = pOVar5->lhs + iVar2 + 1;
          iVar2 = iVar2 + 1 + pOVar5->rhs;
          local_318.second_extension_column_ = iVar2;
          local_318.first_extension_column_ = iVar3;
        }
      }
      if ((Options::step_by_step_type == 2) ||
         ((Options::step_by_step_type == 1 && (pOVar5->operation_type == MainOutput)))) {
        std::ios::widen((char)*(undefined8 *)(local_2e0[0] + -0x18) + (char)local_2e0);
        std::ostream::put((char)local_2e0);
        std::ostream::flush();
        if ((iVar6 != local_324) ||
           ((iVar4 != iVar7 || (bVar8 = iVar3 != iVar2, iVar3 = iVar2, bVar8)))) {
          operator<<((ostream *)local_2e0,&local_318);
          std::ios::widen((char)*(undefined8 *)(local_2e0[0] + -0x18) + (char)local_2e0);
          std::ostream::put((char)local_2e0);
          std::ostream::flush();
          local_318.first_row_ = 0;
          local_318.second_row_ = 0;
          local_318.first_main_column_ = 0;
          local_318.second_main_column_ = 0;
          local_318.first_extension_column_ = 0;
          local_318.second_extension_column_ = 0;
          iVar3 = 0;
          iVar7 = 0;
          local_324 = 0;
        }
        operator<<((ostream *)local_2e0,&local_168.system_);
        iVar6 = local_324;
        iVar2 = iVar3;
        iVar4 = iVar7;
      }
      pOVar5 = pOVar5 + 1;
    } while (pOVar5 != local_2e8);
  }
  psVar1 = local_2f8;
  std::__cxx11::stringbuf::str();
  ~LinearSystem(&local_168);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2e0);
  std::ios_base::~ios_base(local_270);
  return psVar1;
}

Assistant:

std::string LinearSystem::ToString() const {
  std::ostringstream out;
  LinearSystem current_system(start_system_, mode_);
  out << current_system.system_;
  SwapMatrix swaps;
  for (const auto& operation : history_) {
    current_system.ApplyOperation(operation);

    if (operation.operation_type == OperationType::SwapRows) {
      swaps.SetRowSwap(operation.lhs, operation.rhs);
      if (mode_ == Mode::LU) {
        int m = system_.GetMainMatrix().GetNumColumns();
        swaps.SetExtensionColumnSwap(operation.lhs + m, operation.rhs + m);
      }
    } else if (operation.operation_type == OperationType::SwapColumns) {
      swaps.SetMainColumnSwap(operation.lhs, operation.rhs);
    }

    if (Options::step_by_step_type != Options::StepByStepType::AllSteps &&
        (Options::step_by_step_type != Options::StepByStepType::MainSteps ||
            operation.operation_type != OperationType::MainOutput)) {
      continue;
    }

    out << std::endl;

    if (!swaps.IsEmpty()) {
      out << swaps << std::endl;
      swaps.Clear();
    }

    out << current_system.system_;
  }

  return out.str();
}